

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::Subscription::Subscription(Subscription *this,Subscription *to_copy)

{
  _Rb_tree_header *p_Var1;
  
  (this->price_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->price_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->price_fields_)._M_t._M_impl.super__Rb_tree_header;
  (this->price_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->price_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->price_fields_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  price::subject::Subject::Subject(&this->subject_);
  this->status_ = to_copy->status_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator=(&(this->price_fields_)._M_t,&(to_copy->price_fields_)._M_t);
  price::subject::Subject::operator=(&this->subject_,&to_copy->subject_);
  return;
}

Assistant:

Subscription::Subscription(const bidfx_public_api::price::Subscription& to_copy)
{
    status_ = to_copy.status_;
    price_fields_ = to_copy.price_fields_;
    subject_ = to_copy.subject_;
}